

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder_util.c
# Opt level: O0

int aom_compare_img(aom_image_t *img1,aom_image_t *img2)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  uint *in_RSI;
  uint *in_RDI;
  uint32_t i;
  uint32_t width;
  uint32_t height;
  int plane;
  int match;
  uint32_t c_h;
  uint32_t c_w;
  uint32_t l_w;
  int num_planes;
  uint local_3c;
  uint local_34;
  int local_28;
  uint local_24;
  uint local_1c;
  uint local_18;
  
  iVar5 = 3;
  if (in_RDI[4] != 0) {
    iVar5 = 1;
  }
  local_18 = in_RDI[10];
  local_1c = in_RDI[10] + in_RDI[0xe] >> ((byte)in_RDI[0xe] & 0x1f);
  uVar1 = in_RDI[0xb];
  uVar2 = in_RDI[0xf];
  uVar3 = in_RDI[0xf];
  local_24 = (uint)(in_RDI[0xb] == in_RSI[0xb] && (in_RDI[10] == in_RSI[10] && *in_RDI == *in_RSI));
  if ((*in_RDI & 0x800) != 0) {
    local_18 = local_18 << 1;
    local_1c = local_1c << 1;
  }
  for (local_28 = 0; local_28 < iVar5; local_28 = local_28 + 1) {
    if (local_28 == 0) {
      uVar4 = in_RDI[0xb];
      local_3c = local_18;
    }
    else {
      local_3c = local_1c;
      uVar4 = uVar1 + uVar2 >> ((byte)uVar3 & 0x1f);
    }
    for (local_34 = 0; local_34 < uVar4; local_34 = local_34 + 1) {
      iVar6 = memcmp((void *)(*(long *)(in_RDI + (long)local_28 * 2 + 0x10) +
                             (ulong)(local_34 * in_RDI[(long)local_28 + 0x16])),
                     (void *)(*(long *)(in_RSI + (long)local_28 * 2 + 0x10) +
                             (ulong)(local_34 * in_RSI[(long)local_28 + 0x16])),(ulong)local_3c);
      local_24 = iVar6 == 0 & local_24;
    }
  }
  return local_24;
}

Assistant:

int aom_compare_img(const aom_image_t *const img1,
                    const aom_image_t *const img2) {
  assert(img1->cp == img2->cp);
  assert(img1->tc == img2->tc);
  assert(img1->mc == img2->mc);
  assert(img1->monochrome == img2->monochrome);

  int num_planes = img1->monochrome ? 1 : 3;

  uint32_t l_w = img1->d_w;
  uint32_t c_w = (img1->d_w + img1->x_chroma_shift) >> img1->x_chroma_shift;
  const uint32_t c_h =
      (img1->d_h + img1->y_chroma_shift) >> img1->y_chroma_shift;
  int match = 1;

  match &= (img1->fmt == img2->fmt);
  match &= (img1->d_w == img2->d_w);
  match &= (img1->d_h == img2->d_h);
  if (img1->fmt & AOM_IMG_FMT_HIGHBITDEPTH) {
    l_w *= 2;
    c_w *= 2;
  }

  for (int plane = 0; plane < num_planes; ++plane) {
    uint32_t height = plane ? c_h : img1->d_h;
    uint32_t width = plane ? c_w : l_w;

    for (uint32_t i = 0; i < height; ++i) {
      match &=
          (memcmp(img1->planes[plane] + i * img1->stride[plane],
                  img2->planes[plane] + i * img2->stride[plane], width) == 0);
    }
  }

  return match;
}